

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackCheck.cpp
# Opt level: O0

Pass * wasm::createStackCheckPass(void)

{
  Pass *this;
  
  this = (Pass *)operator_new(0x58);
  StackCheck::StackCheck((StackCheck *)this);
  return this;
}

Assistant:

Pass* createStackCheckPass() { return new StackCheck; }